

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O0

void __thiscall QtMWidgets::BusyIndicator::BusyIndicator(BusyIndicator *this,QWidget *parent)

{
  BusyIndicatorPrivate *this_00;
  BusyIndicatorPrivate *this_01;
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  BusyIndicator *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_0023f100;
  *(undefined **)&this->field_0x10 = &DAT_0023f2b0;
  this_00 = (BusyIndicatorPrivate *)operator_new(0x38);
  BusyIndicatorPrivate::BusyIndicatorPrivate(this_00,this);
  QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::BusyIndicatorPrivate,_QScopedPointerDeleter<QtMWidgets::BusyIndicatorPrivate>_>
            ::operator->(&this->d);
  BusyIndicatorPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

BusyIndicator::BusyIndicator( QWidget * parent )
	:	QWidget( parent )
	,	d( new BusyIndicatorPrivate( this ) )
{
	d->init();
}